

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateGarfieldGasTableForLiquidNoble.cpp
# Opt level: O1

int PassConstantBody(ofstream *outFile,string *element)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)outFile," E-B angles",0xb);
  cVar1 = (char)outFile;
  std::ios::widen((char)*(undefined8 *)(*(long *)outFile + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)outFile," 1.57079633E+00",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)outFile + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)outFile," B fields",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)outFile + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)outFile," 0.00000000E+00",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)outFile + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)outFile," Mixture:",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)outFile + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  iVar2 = std::__cxx11::string::compare((char *)element);
  if (iVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)outFile,
               " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00",0x4b);
    std::ios::widen((char)*(undefined8 *)(*(long *)outFile + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)outFile,
               " 0.00000000E+00 1.00000000E+02 0.00000000E+00 0.00000000E+00 0.00000000E+00",0x4b);
    std::ios::widen((char)*(undefined8 *)(*(long *)outFile + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)outFile,
               " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00",0x4b);
    std::ios::widen((char)*(undefined8 *)(*(long *)outFile + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)outFile,
               " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00",0x4b);
    std::ios::widen((char)*(undefined8 *)(*(long *)outFile + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)outFile,
               " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00",0x4b);
    std::ios::widen((char)*(undefined8 *)(*(long *)outFile + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)outFile,
               " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00",0x4b);
    std::ios::widen((char)*(undefined8 *)(*(long *)outFile + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)outFile,
               " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00",0x4b);
    std::ios::widen((char)*(undefined8 *)(*(long *)outFile + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)outFile,
               " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00",0x4b);
    std::ios::widen((char)*(undefined8 *)(*(long *)outFile + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)outFile,
               " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00",0x4b);
    std::ios::widen((char)*(undefined8 *)(*(long *)outFile + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)outFile,
               " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00",0x4b);
    std::ios::widen((char)*(undefined8 *)(*(long *)outFile + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)outFile,
               " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00",0x4b);
    std::ios::widen((char)*(undefined8 *)(*(long *)outFile + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)outFile,
               " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00",0x4b);
    std::ios::widen((char)*(undefined8 *)(*(long *)outFile + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)outFile," The gas tables follow:",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)outFile + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)outFile," ",1);
    iVar2 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "----> NEST cannot currently generate the mixture for your element ",0x42);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(element->_M_dataplus)._M_p,element->_M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,". Right now, NEST only supports LXe.",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int PassConstantBody(std::ofstream& outFile, std::string element) {
  outFile << " E-B angles" << std::endl;
  outFile << " 1.57079633E+00" << std::endl;
  outFile << " B fields" << std::endl;
  outFile << " 0.00000000E+00" << std::endl;
  outFile << " Mixture:" << std::endl;

  // This is a dumb, hack-y way to do things, but for now, when we are only
  // looking at pure Xe or Ar, it's simpler than trying to use Garfield's
  // mixture codes. But since this code is somewhat modular, one can easily come
  // back and improve this later if it is so desired.
  if (element == "Xe") {
    outFile << " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
    outFile << " 0.00000000E+00 1.00000000E+02 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
    outFile << " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
    outFile << " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
    outFile << " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
    outFile << " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
    outFile << " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
    outFile << " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
    outFile << " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
    outFile << " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
    outFile << " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
    outFile << " 0.00000000E+00 0.00000000E+00 0.00000000E+00 0.00000000E+00 "
               "0.00000000E+00"
            << std::endl;
  } else {
    std::cout
        << "----> NEST cannot currently generate the mixture for your element "
        << element << ". Right now, NEST only supports LXe." << std::endl;
    return -1;
  }

  outFile << " The gas tables follow:" << std::endl;
  outFile << " ";
  return 0;
}